

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::HasCMP0054AlreadyBeenReported(cmMakefile *this)

{
  pair<std::_Rb_tree_iterator<cmListFileContext>,_bool> pVar1;
  cmListFileContext local_58;
  
  GetExecutionContext(&local_58,this);
  pVar1 = std::
          _Rb_tree<cmListFileContext,_cmListFileContext,_std::_Identity<cmListFileContext>,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>
          ::_M_insert_unique<cmListFileContext>(&(this->CMP0054ReportedIds)._M_t,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.FilePath._M_dataplus._M_p != &local_58.FilePath.field_2) {
    operator_delete(local_58.FilePath._M_dataplus._M_p,
                    local_58.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.Name._M_dataplus._M_p != &local_58.Name.field_2) {
    operator_delete(local_58.Name._M_dataplus._M_p,local_58.Name.field_2._M_allocated_capacity + 1);
  }
  return (bool)(~pVar1.second & 1);
}

Assistant:

bool cmMakefile::HasCMP0054AlreadyBeenReported() const
{
  return !this->CMP0054ReportedIds.insert(this->GetExecutionContext()).second;
}